

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_1::getUniformName
                   (string *__return_storage_ptr__,string *name,int declNdx)

{
  int local_3c;
  string local_38;
  
  local_3c = declNdx;
  de::toString<int>(&local_38,&local_3c);
  std::operator+(__return_storage_ptr__,name,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getUniformName (const std::string& name, int declNdx)
{
	return name + de::toString(declNdx);
}